

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

QRgbaFloat32 *
qt_fetch_radial_gradient_rgbfp
          (QRgbaFloat32 *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  QRgbaFloat32 *pQVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  double dVar9;
  undefined8 uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  Type TVar18;
  
  dVar1 = (op->field_16).radial.a;
  uVar5 = -(ulong)(dVar1 < -dVar1);
  if (1e-12 < (double)(~uVar5 & (ulong)dVar1 | (ulong)-dVar1 & uVar5)) {
    dVar12 = (double)y + 0.5;
    dVar6 = (double)x + 0.5;
    dVar17 = data->m11;
    dVar3 = data->m12;
    dVar7 = data->m13;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      bVar2 = false;
    }
    else {
      bVar2 = data->m23 == 0.0;
    }
    dVar15 = dVar6 * dVar17 + dVar12 * data->m21 + data->dx;
    dVar16 = dVar6 * dVar3 + dVar12 * data->m22 + data->dy;
    dVar14 = 1.0 / (dVar1 + dVar1);
    if (!bVar2) {
      if (length < 1) {
        return buffer;
      }
      dVar1 = dVar7 * dVar6 + dVar12 * data->m23 + data->m33;
      pQVar4 = buffer;
      do {
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar7 = dVar15 * (1.0 / dVar1) - *(double *)((long)&data->field_23 + 0x20);
          dVar12 = dVar16 * (1.0 / dVar1) - *(double *)((long)&data->field_23 + 0x28);
          dVar17 = (op->field_16).linear.dy * dVar12 +
                   (op->field_16).linear.l * *(double *)((long)&data->field_23 + 0x30) +
                   (op->field_16).linear.dx * dVar7;
          dVar17 = dVar17 + dVar17;
          dVar7 = dVar17 * dVar17 +
                  (op->field_16).radial.a * -4.0 *
                  ((op->field_16).linear.off - (dVar7 * dVar7 + dVar12 * dVar12));
          uVar8 = 0;
          if (dVar7 < 0.0) {
            uVar10 = 0;
          }
          else {
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            uVar8 = 0;
            dVar12 = (-dVar17 - dVar7) * dVar14;
            dVar7 = (dVar7 - dVar17) * dVar14;
            if (dVar7 <= dVar12) {
              dVar7 = dVar12;
            }
            uVar10 = 0;
            if (0.0 <= (op->field_16).linear.l * dVar7 + *(double *)((long)&data->field_23 + 0x30))
            {
              TVar18 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar7);
              uVar8 = TVar18._8_8_;
              uVar10 = TVar18._0_8_;
            }
          }
          pQVar4->r = (float)(int)uVar10;
          pQVar4->g = (float)(int)((ulong)uVar10 >> 0x20);
          pQVar4->b = (float)(int)uVar8;
          pQVar4->a = (float)(int)((ulong)uVar8 >> 0x20);
        }
        else {
          pQVar4->r = 0.0;
          pQVar4->g = 0.0;
          pQVar4->b = 0.0;
          pQVar4->a = 0.0;
        }
        dVar15 = dVar15 + data->m11;
        dVar16 = dVar16 + data->m12;
        dVar1 = dVar1 + data->m13;
        pQVar4 = pQVar4 + 1;
      } while (pQVar4 < buffer + length);
      return buffer;
    }
    dVar15 = dVar15 - *(double *)((long)&data->field_23 + 0x20);
    dVar16 = dVar16 - *(double *)((long)&data->field_23 + 0x28);
    dVar7 = (op->field_16).linear.dx;
    dVar12 = (op->field_16).linear.dy;
    dVar11 = dVar16 * dVar12 +
             (op->field_16).linear.l * *(double *)((long)&data->field_23 + 0x30) + dVar15 * dVar7;
    dVar11 = dVar11 + dVar11;
    dVar1 = dVar1 * 4.0;
    dVar9 = dVar14 * dVar14;
    dVar6 = (dVar11 * dVar11 -
            ((op->field_16).linear.off - (dVar15 * dVar15 + dVar16 * dVar16)) * dVar1) * dVar9;
    if ((uint)ABS((float)dVar6) < 0x7f800000) {
      dVar12 = dVar7 * dVar17 + dVar12 * dVar3;
      dVar12 = dVar12 + dVar12;
      dVar13 = dVar17 * dVar17 + dVar3 * dVar3;
      dVar7 = dVar3 * dVar16 + dVar15 * dVar17;
      dVar7 = ((dVar7 + dVar7 + dVar13) * dVar1 + dVar12 * dVar12 + (dVar11 + dVar11) * dVar12) *
              dVar9;
      if (((uint)ABS((float)dVar7) < 0x7f800000) &&
         (dVar9 = dVar9 * (dVar1 * (dVar13 + dVar13) + (dVar12 + dVar12) * dVar12),
         (uint)ABS((float)dVar9) < 0x7f800000)) {
        RadialFetchPlain<GradientBaseFP>::fetch
                  (buffer,buffer + length,op,data,dVar6,dVar7,dVar9,dVar11 * dVar14,dVar12 * dVar14)
        ;
        return buffer;
      }
    }
  }
  (*qt_memfill64)((quint64 *)buffer,0,(long)length);
  return buffer;
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL qt_fetch_radial_gradient_rgbfp(QRgbaFloat32 *buffer, const Operator *op, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_radial_gradient_template<RadialFetchPlain<GradientBaseFP>, QRgbaFloat32>(buffer, op, data, y, x, length);
}